

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.h
# Opt level: O0

void __thiscall Assimp::IRRImporter::Node::Node(Node *this,ET t)

{
  allocator<char> local_b9;
  string local_b8 [32];
  char local_98 [8];
  char buffer [128];
  ET t_local;
  Node *this_local;
  
  this->type = t;
  buffer._124_4_ = t;
  aiVector3t<float>::aiVector3t(&this->position);
  aiVector3t<float>::aiVector3t(&this->rotation);
  aiVector3t<float>::aiVector3t(&this->scaling,1.0,1.0,1.0);
  std::__cxx11::string::string((string *)&this->name);
  std::vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>::vector
            (&this->children);
  this->parent = (Node *)0x0;
  this->framesPerSecond = 0.0;
  std::__cxx11::string::string((string *)&this->meshPath);
  this->id = 0;
  std::
  vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ::vector(&this->materials);
  this->sphereRadius = 1.0;
  this->spherePolyCountX = 100;
  this->spherePolyCountY = 100;
  std::__cxx11::list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
  ::list(&this->animators);
  Node::cnt = Node::cnt + 1;
  snprintf(local_98,0x80,"IrrNode_%i");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,local_98,&local_b9);
  std::__cxx11::string::operator=((string *)&this->name,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::
  vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
  ::reserve(&this->materials,5);
  std::vector<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>::reserve
            (&this->children,5);
  return;
}

Assistant:

explicit Node(ET t)
            :   type                (t)
            ,   scaling             (1.0,1.0,1.0) // assume uniform scaling by default
            ,   parent()
            ,   framesPerSecond     (0.0)
            ,   id()
            ,   sphereRadius        (1.0)
            ,   spherePolyCountX    (100)
            ,   spherePolyCountY    (100)
        {

            // Generate a default name for the node
            char buffer[128];
            static int cnt;
            ai_snprintf(buffer, 128, "IrrNode_%i",cnt++);
            name = std::string(buffer);

            // reserve space for up to 5 materials
            materials.reserve(5);

            // reserve space for up to 5 children
            children.reserve(5);
        }